

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O0

bool __thiscall
cmm::CMMParser::parseBinOpRHS
          (CMMParser *this,int8_t ExprPrec,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res)

{
  undefined4 TokenKind_00;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> this_00;
  bool bVar1;
  string *psVar2;
  InfixOpExprAST *this_01;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_c8;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_c0;
  BinaryOperatorAST local_b8;
  int8_t local_95;
  TokenKind local_94;
  undefined1 local_90 [3];
  int8_t NextPrec;
  string Symbol;
  int8_t TokPrec;
  TokenKind TokenKind;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_60;
  BinaryOperatorAST local_58;
  Token local_34;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_30;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> RHS;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res_local;
  int8_t ExprPrec_local;
  CMMParser *this_local;
  
  RHS._M_t.super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
  super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
  super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
       (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)Res
  ;
  std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
  unique_ptr<std::default_delete<cmm::ExpressionAST>,void>
            ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)&local_30);
  local_34 = CMMLexer::getTok(&this->Lexer);
  bVar1 = Token::is(&local_34,Equal);
  if (bVar1) {
    local_58.LHS._M_t.
    super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
    super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl._0_4_ = Lex(this);
    bVar1 = parseExpression(this,&local_30);
    if (bVar1) {
      this_local._7_1_ = 1;
      local_58.super_ExpressionAST._12_4_ = 1;
    }
    else {
      std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
                (&local_60,
                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 RHS._M_t.
                 super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                 .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl);
      std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
                ((unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &stack0xffffffffffffff98,&local_30);
      BinaryOperatorAST::create
                (&local_58,Equal,&local_60,
                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &stack0xffffffffffffff98);
      std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator=
                ((unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 RHS._M_t.
                 super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                 .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &local_58);
      std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                ((unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &local_58);
      std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                ((unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &stack0xffffffffffffff98);
      std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                (&local_60);
      this_local._7_1_ = 0;
      local_58.super_ExpressionAST._12_4_ = 1;
    }
  }
  else {
    do {
      Symbol.field_2._12_4_ = getKind(this);
      Symbol.field_2._M_local_buf[0xb] = getBinOpPrecedence(this);
      if (Symbol.field_2._M_local_buf[0xb] < ExprPrec) {
        this_local._7_1_ = 0;
        local_58.super_ExpressionAST._12_4_ = 1;
        break;
      }
      psVar2 = CMMLexer::getStrVal_abi_cxx11_(&this->Lexer);
      std::__cxx11::string::string((string *)local_90,(string *)psVar2);
      local_94 = (TokenKind)Lex(this);
      bVar1 = parsePrimaryExpression(this,&local_30);
      if (bVar1) {
        this_local._7_1_ = 1;
        local_58.super_ExpressionAST._12_4_ = 1;
      }
      else {
        local_95 = getBinOpPrecedence(this);
        if (Symbol.field_2._M_local_buf[0xb] < local_95) {
          Symbol.field_2._M_local_buf[0xb] = Symbol.field_2._M_local_buf[0xb] + '\x01';
          bVar1 = parseBinOpRHS(this,Symbol.field_2._M_local_buf[0xb],&local_30);
          if (bVar1) {
            this_local._7_1_ = 1;
            local_58.super_ExpressionAST._12_4_ = 1;
            goto LAB_0010fcf2;
          }
        }
        this_00._M_t.
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl =
             RHS._M_t.
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        TokenKind_00 = Symbol.field_2._12_4_;
        if (Symbol.field_2._12_4_ == 4) {
          this_01 = (InfixOpExprAST *)operator_new(0x40);
          local_b8.super_ExpressionAST._15_1_ = 1;
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
                    (&local_b8.RHS,
                     (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                     RHS._M_t.
                     super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                     .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
                    (&local_b8.LHS,&local_30);
          InfixOpExprAST::InfixOpExprAST(this_01,(string *)local_90,&local_b8.RHS,&local_b8.LHS);
          local_b8.super_ExpressionAST._15_1_ = 0;
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::reset
                    ((unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                     this_00._M_t.
                     super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                     .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
                     (pointer)this_01);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                    (&local_b8.LHS);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                    (&local_b8.RHS);
        }
        else {
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
                    (&local_c0,
                     (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                     RHS._M_t.
                     super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                     .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
                    (&local_c8,&local_30);
          BinaryOperatorAST::tryFoldBinOp(&local_b8,TokenKind_00,&local_c0,&local_c8);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator=
                    ((unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                     RHS._M_t.
                     super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                     .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
                     (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                     &local_b8);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                    ((unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                     &local_b8);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                    (&local_c8);
          std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
                    (&local_c0);
        }
        local_58.super_ExpressionAST._12_4_ = 0;
      }
LAB_0010fcf2:
      std::__cxx11::string::~string((string *)local_90);
    } while (local_58.super_ExpressionAST._12_4_ == 0);
  }
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
            (&local_30);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CMMParser::parseBinOpRHS(int8_t ExprPrec,
                              std::unique_ptr<ExpressionAST> &Res) {
  std::unique_ptr<ExpressionAST> RHS;

  // Handle assignment expression first.
  if (Lexer.getTok().is(Token::Equal)) {
    Lex();
    if (parseExpression(RHS))
      return true;
    Res = BinaryOperatorAST::create(Token::Equal,
                                    std::move(Res), std::move(RHS));
    return false;
  }
  for (;;) {
    Token::TokenKind TokenKind = getKind();

    // If this is a binOp, find its precedence.
    int8_t TokPrec = getBinOpPrecedence();
    // If the next token is lower precedence than we are allowed to eat,
    // return successfully with what we ate already.
    if (TokPrec < ExprPrec)
      return false;

    // Save the potential symbol before lex.
    std::string Symbol = Lexer.getStrVal();
    // Eat the binary operator.
    Lex();
    // Eat the next primary expression.
    if (parsePrimaryExpression(RHS))
      return true;

    // If BinOp binds less tightly with RHS than the operator after RHS, let
    // the pending operator take RHS as its LHS.
    int8_t NextPrec = getBinOpPrecedence();
    if (TokPrec < NextPrec && parseBinOpRHS(++TokPrec, RHS))
      return true;

    // Merge LHS and RHS according to operator.
    if (TokenKind == Token::InfixOp)
      Res.reset(new InfixOpExprAST(Symbol, std::move(Res), std::move(RHS)));
    else
      Res = BinaryOperatorAST::tryFoldBinOp(TokenKind, std::move(Res),
                                             std::move(RHS));
  }
}